

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O2

bool __thiscall xLearn::Checker::check_train_options(Checker *this,HyperParam *hyper_param)

{
  string *psVar1;
  string *psVar2;
  string *psVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  string *psVar12;
  float fVar13;
  double dVar14;
  StringList list;
  string similar_str;
  StrSimilar ss;
  string local_50;
  
  bVar5 = FileExist((this->args_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
  if (!bVar5) {
    StringPrintf_abi_cxx11_
              (&similar_str,"Training data file: %s does not exist.",
               (this->args_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    Color::print_error(&similar_str);
    std::__cxx11::string::~string((string *)&similar_str);
    return false;
  }
  std::__cxx11::string::string
            ((string *)&similar_str,
             (string *)
             ((this->args_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1));
  std::__cxx11::string::operator=((string *)&hyper_param->train_set_file,(string *)&similar_str);
  std::__cxx11::string::~string((string *)&similar_str);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
             (this->args_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2,
             (this->args_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&similar_str);
  psVar1 = &hyper_param->opt_type;
  psVar2 = &hyper_param->metric;
  psVar3 = &hyper_param->loss_func;
  bVar5 = true;
  uVar10 = 0;
LAB_0013fe60:
  uVar11 = (ulong)uVar10;
  if ((ulong)((long)list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar11) {
    if (bVar5) {
      check_conflict_train
                ((Checker *)
                 list.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,hyper_param);
      if (((hyper_param->model_file)._M_string_length == 0) &&
         (hyper_param->cross_validation == false)) {
        std::operator+(&similar_str,&hyper_param->train_set_file,".model");
        std::__cxx11::string::operator=((string *)&hyper_param->model_file,(string *)&similar_str);
        std::__cxx11::string::~string((string *)&similar_str);
      }
      iVar7 = std::__cxx11::string::compare((char *)psVar2);
      bVar5 = true;
      if (iVar7 == 0) {
        std::__cxx11::string::assign((char *)psVar2);
      }
    }
    else {
LAB_00140a96:
      bVar5 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&list);
    return bVar5;
  }
  iVar7 = std::__cxx11::string::compare
                    ((char *)(list.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar11));
  iVar9 = 2;
  if (iVar7 == 0) {
    iVar7 = atoi((list.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar11)[1]._M_dataplus._M_p);
    switch(iVar7) {
    case 0:
    case 3:
      std::__cxx11::string::assign((char *)psVar3);
      break;
    case 4:
    case 1:
      std::__cxx11::string::assign((char *)psVar3);
      break;
    case 5:
    case 2:
      std::__cxx11::string::assign((char *)psVar3);
      break;
    default:
      std::__cxx11::string::string
                ((string *)&similar_str,
                 "-s can only be [0 - 5] : \n  for classification task: \n    0 -- linear model (GLM) \n    1 -- factorization machines (FM) \n    2 -- field-aware factorization machines (FFM) \n  for regression task: \n    3 -- linear model (GLM) \n    4 -- factorization machines (FM) \n    5 -- field-aware factorization machines (FFM)"
                 ,(allocator *)&local_50);
      Color::print_error(&similar_str);
LAB_00140232:
      std::__cxx11::string::~string((string *)&similar_str);
      bVar5 = false;
      goto LAB_00140527;
    }
    std::__cxx11::string::assign((char *)&hyper_param->score_func);
  }
  else {
    iVar7 = std::__cxx11::string::compare
                      ((char *)(list.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar11));
    if (iVar7 == 0) {
      lVar4 = uVar11 + 1;
      iVar7 = std::__cxx11::string::compare
                        ((char *)(list.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar4));
      psVar12 = (string *)psVar2;
      if (((((iVar7 != 0) &&
            (iVar7 = std::__cxx11::string::compare
                               ((char *)(list.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar4)),
            iVar7 != 0)) &&
           (iVar7 = std::__cxx11::string::compare
                              ((char *)(list.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar4)),
           iVar7 != 0)) &&
          ((((iVar7 = std::__cxx11::string::compare
                                ((char *)(list.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar4)),
             iVar7 != 0 &&
             (iVar7 = std::__cxx11::string::compare
                                ((char *)(list.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar4)),
             iVar7 != 0)) &&
            ((iVar7 = std::__cxx11::string::compare
                                ((char *)(list.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar4)),
             iVar7 != 0 &&
             ((iVar7 = std::__cxx11::string::compare
                                 ((char *)(list.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar4)),
              iVar7 != 0 &&
              (iVar7 = std::__cxx11::string::compare
                                 ((char *)(list.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar4)),
              iVar7 != 0)))))) &&
           (iVar7 = std::__cxx11::string::compare
                              ((char *)(list.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar4)),
           iVar7 != 0)))) &&
         (iVar7 = std::__cxx11::string::compare
                            ((char *)(list.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar4)),
         iVar7 != 0)) {
        StringPrintf_abi_cxx11_
                  (&similar_str,
                   "Unknow metric: %s \n -x can only be: \n   acc \n   prec \n   recall \n   f1 \n   auc\n   mae \n   mape \n   rmsd \n   rmse \n   none"
                   ,list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar4]._M_dataplus._M_p);
        Color::print_error(&similar_str);
        goto LAB_00140232;
      }
    }
    else {
      iVar7 = std::__cxx11::string::compare
                        ((char *)(list.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar11));
      if (iVar7 == 0) {
        lVar4 = uVar11 + 1;
        iVar7 = std::__cxx11::string::compare
                          ((char *)(list.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar4));
        psVar12 = (string *)psVar1;
        if (((iVar7 != 0) &&
            (iVar7 = std::__cxx11::string::compare
                               ((char *)(list.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar4)),
            iVar7 != 0)) &&
           (iVar7 = std::__cxx11::string::compare
                              ((char *)(list.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar4)),
           iVar7 != 0)) {
          StringPrintf_abi_cxx11_
                    (&similar_str,
                     "Unknow optimization method: %s \n -o can only be: adagrad and ftrl. \n",
                     list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar4]._M_dataplus._M_p);
          Color::print_error(&similar_str);
          goto LAB_00140232;
        }
      }
      else {
        iVar7 = std::__cxx11::string::compare
                          ((char *)(list.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar11));
        if (iVar7 == 0) {
          bVar6 = FileExist(list.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar11 + 1]._M_dataplus._M_p);
          psVar12 = (string *)&hyper_param->validate_set_file;
          if (!bVar6) {
            StringPrintf_abi_cxx11_
                      (&similar_str,"Validation set file: %s dose not exists.",
                       list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar11 + 1]._M_dataplus._M_p);
            Color::print_error(&similar_str);
            goto LAB_00140232;
          }
        }
        else {
          iVar7 = std::__cxx11::string::compare
                            ((char *)(list.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar11));
          psVar12 = (string *)&hyper_param->model_file;
          if (iVar7 != 0) {
            iVar7 = std::__cxx11::string::compare
                              ((char *)(list.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar11));
            psVar12 = (string *)&hyper_param->txt_model_file;
            if (iVar7 != 0) {
              iVar7 = std::__cxx11::string::compare
                                ((char *)(list.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar11));
              psVar12 = (string *)&hyper_param->log_file;
              if (iVar7 != 0) {
                iVar7 = std::__cxx11::string::compare
                                  ((char *)(list.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar11));
                if (iVar7 == 0) {
                  uVar8 = atoi((list.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar11)[1]._M_dataplus.
                               _M_p);
                  if ((int)uVar8 < 1) {
                    StringPrintf_abi_cxx11_
                              (&similar_str,"Illegal -k \'%i\'. -k must be geater than zero.",
                               (ulong)uVar8);
                    Color::print_error(&similar_str);
                    goto LAB_00140232;
                  }
                  hyper_param->num_K = uVar8;
                }
                else {
                  iVar7 = std::__cxx11::string::compare
                                    ((char *)(list.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + uVar11));
                  if (iVar7 == 0) {
                    dVar14 = atof((list.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar11)[1].
                                  _M_dataplus._M_p);
                    fVar13 = (float)dVar14;
                    if (fVar13 <= 0.0) {
                      StringPrintf_abi_cxx11_
                                (&similar_str,"Illegal -r : \'%f\'. -r must be greater than zero.",
                                 (double)fVar13);
                      Color::print_error(&similar_str);
                      goto LAB_00140232;
                    }
                    hyper_param->learning_rate = fVar13;
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare
                                      ((char *)(list.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar11))
                    ;
                    if (iVar7 == 0) {
                      dVar14 = atof((list.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar11)[1].
                                    _M_dataplus._M_p);
                      fVar13 = (float)dVar14;
                      if (fVar13 < 0.0) {
                        StringPrintf_abi_cxx11_
                                  (&similar_str,
                                   "Illegal -b : \'%f\' -b must be greater than or equal to zero.",
                                   (double)fVar13);
                        Color::print_error(&similar_str);
                        goto LAB_00140232;
                      }
                      hyper_param->regu_lambda = fVar13;
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare
                                        ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                 ));
                      if (iVar7 == 0) {
                        dVar14 = atof((list.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar11)[1].
                                      _M_dataplus._M_p);
                        fVar13 = (float)dVar14;
                        if (fVar13 <= 0.0) {
                          StringPrintf_abi_cxx11_
                                    (&similar_str,
                                     "Illegal -u : \'%f\'. -u must be greater than zero.",
                                     (double)fVar13);
                          Color::print_error(&similar_str);
                          goto LAB_00140232;
                        }
                        hyper_param->model_scale = fVar13;
                      }
                      else {
                        iVar7 = std::__cxx11::string::compare
                                          ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                        if (iVar7 == 0) {
                          uVar8 = atoi((list.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar11)[1].
                                       _M_dataplus._M_p);
                          if ((int)uVar8 < 0) {
                            StringPrintf_abi_cxx11_
                                      (&similar_str,
                                       "Illegal -e : \'%i\'. -e must be greater than zero.",
                                       (ulong)uVar8);
                            Color::print_error(&similar_str);
                            goto LAB_00140232;
                          }
                          hyper_param->num_epoch = uVar8;
                        }
                        else {
                          iVar7 = std::__cxx11::string::compare
                                            ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                          if (iVar7 == 0) {
                            uVar8 = atoi((list.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar11)[1].
                                         _M_dataplus._M_p);
                            if ((int)uVar8 < 0) {
                              StringPrintf_abi_cxx11_
                                        (&similar_str,
                                         "Illegal -f : \'%i\'. -f must be greater than zero.",
                                         (ulong)uVar8);
                              Color::print_error(&similar_str);
                              goto LAB_00140232;
                            }
                            hyper_param->num_folds = uVar8;
                          }
                          else {
                            iVar7 = std::__cxx11::string::compare
                                              ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                            psVar12 = (string *)&hyper_param->pre_model_file;
                            if (iVar7 == 0) goto LAB_0014051c;
                            iVar7 = std::__cxx11::string::compare
                                              ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                            if (iVar7 == 0) {
                              uVar8 = atoi((list.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar11)[1].
                                           _M_dataplus._M_p);
                              if ((int)uVar8 < 1) {
                                StringPrintf_abi_cxx11_
                                          (&similar_str,
                                           "Illegal -nthread : \'%i\'. -nthread must be greater than zero."
                                           ,(ulong)uVar8);
                                Color::print_error(&similar_str);
                                goto LAB_00140232;
                              }
                              hyper_param->thread_number = uVar8;
                            }
                            else {
                              iVar7 = std::__cxx11::string::compare
                                                ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                              if (iVar7 == 0) {
                                uVar8 = atoi((list.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + uVar11)[1]
                                             ._M_dataplus._M_p);
                                if ((int)uVar8 < 1) {
                                  StringPrintf_abi_cxx11_
                                            (&similar_str,
                                             "Illegal -block : \'%i\'. -block must be greater than zero."
                                             ,(ulong)uVar8);
                                  Color::print_error(&similar_str);
                                  goto LAB_00140232;
                                }
                                hyper_param->block_size = uVar8;
                              }
                              else {
                                iVar7 = std::__cxx11::string::compare
                                                  ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                                if (iVar7 == 0) {
                                  uVar8 = atoi((list.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar11)
                                               [1]._M_dataplus._M_p);
                                  if ((int)uVar8 < 1) {
                                    StringPrintf_abi_cxx11_
                                              (&similar_str,
                                               "Illegal -sw : \'%i\'. -sw must be greater than or equal to 1."
                                               ,(ulong)uVar8);
                                    Color::print_error(&similar_str);
                                    goto LAB_00140232;
                                  }
                                  hyper_param->stop_window = uVar8;
                                }
                                else {
                                  iVar7 = std::__cxx11::string::compare
                                                    ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                                  if (iVar7 == 0) {
                                    uVar8 = atoi((list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                 )[1]._M_dataplus._M_p);
                                    if ((int)uVar8 < 1) {
                                      StringPrintf_abi_cxx11_
                                                (&similar_str,
                                                 "Illegal -seed : \'%i\'. -seed must be greater than or equal to 1."
                                                 ,(ulong)uVar8);
                                      Color::print_error(&similar_str);
                                      goto LAB_00140232;
                                    }
                                    hyper_param->seed = uVar8;
                                    goto LAB_00140527;
                                  }
                                  iVar7 = std::__cxx11::string::compare
                                                    ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                                  if (iVar7 == 0) {
                                    hyper_param->on_disk = true;
                                  }
                                  else {
                                    iVar7 = std::__cxx11::string::compare
                                                      ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                                    if (iVar7 == 0) {
                                      hyper_param->cross_validation = true;
                                    }
                                    else {
                                      iVar7 = std::__cxx11::string::compare
                                                        ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                                      if (iVar7 == 0) {
                                        hyper_param->lock_free = false;
                                      }
                                      else {
                                        iVar7 = std::__cxx11::string::compare
                                                          ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                                        if (iVar7 == 0) {
                                          hyper_param->early_stop = false;
                                        }
                                        else {
                                          iVar7 = std::__cxx11::string::compare
                                                            ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                                          if (iVar7 == 0) {
                                            hyper_param->norm = false;
                                          }
                                          else {
                                            iVar7 = std::__cxx11::string::compare
                                                              ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                                            if (iVar7 == 0) {
                                              hyper_param->bin_out = false;
                                            }
                                            else {
                                              iVar7 = std::__cxx11::string::compare
                                                                ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                                              if (iVar7 != 0) {
                                                iVar7 = std::__cxx11::string::compare
                                                                  ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                                                if (iVar7 == 0) {
                                                  dVar14 = atof((list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  )[1]._M_dataplus._M_p);
                                                  fVar13 = (float)dVar14;
                                                  if (fVar13 <= 0.0) {
                                                    StringPrintf_abi_cxx11_
                                                              (&similar_str,
                                                                                                                              
                                                  "Illegal -alpha : \'%f\'. -alpha must be greater than zero."
                                                  ,(double)fVar13);
                                                  Color::print_error(&similar_str);
                                                  goto LAB_00140232;
                                                  }
                                                  hyper_param->alpha = fVar13;
                                                }
                                                else {
                                                  iVar7 = std::__cxx11::string::compare
                                                                    ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                                                  if (iVar7 == 0) {
                                                    dVar14 = atof((list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  )[1]._M_dataplus._M_p);
                                                  fVar13 = (float)dVar14;
                                                  if (fVar13 < 0.0) {
                                                    StringPrintf_abi_cxx11_
                                                              (&similar_str,
                                                                                                                              
                                                  "Illegal -beta : \'%f\'. -beta cannot be less than zero."
                                                  ,(double)fVar13);
                                                  Color::print_error(&similar_str);
                                                  goto LAB_00140232;
                                                  }
                                                  hyper_param->beta = fVar13;
                                                  }
                                                  else {
                                                    iVar7 = std::__cxx11::string::compare
                                                                      ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                                                  if (iVar7 != 0) {
                                                    iVar7 = std::__cxx11::string::compare
                                                                      ((char *)(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ));
                                                  if (iVar7 == 0) {
                                                    dVar14 = atof(list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar11 + 1]._M_dataplus._M_p);
                                                  fVar13 = (float)dVar14;
                                                  if (fVar13 < 0.0) {
                                                    StringPrintf_abi_cxx11_
                                                              (&similar_str,
                                                                                                                              
                                                  "Illegal -lambda_2 : \'%f\'. -lambda_2 cannot be less than zero."
                                                  ,(double)fVar13);
                                                  Color::print_error(&similar_str);
                                                  goto LAB_00140232;
                                                  }
                                                  hyper_param->lambda_2 = fVar13;
                                                  goto LAB_00140527;
                                                  }
                                                  similar_str._M_dataplus._M_p =
                                                       (pointer)&similar_str.field_2;
                                                  similar_str._M_string_length = 0;
                                                  similar_str.field_2._M_local_buf[0] = '\0';
                                                  StrSimilar::FindSimilar
                                                            (&ss,list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  ,&this->menu_,&similar_str);
                                                  StringPrintf_abi_cxx11_
                                                            (&local_50,
                                                                                                                          
                                                  "Unknow argument \'%s\'. Do you mean \'%s\' ?",
                                                  list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                                  _M_dataplus._M_p,similar_str._M_dataplus._M_p);
                                                  Color::print_error(&local_50);
                                                  std::__cxx11::string::~string((string *)&local_50)
                                                  ;
                                                  std::__cxx11::string::~string
                                                            ((string *)&similar_str);
                                                  goto LAB_00140a96;
                                                  }
                                                  dVar14 = atof((list.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar11
                                                  )[1]._M_dataplus._M_p);
                                                  fVar13 = (float)dVar14;
                                                  if (fVar13 < 0.0) {
                                                    StringPrintf_abi_cxx11_
                                                              (&similar_str,
                                                                                                                              
                                                  "Illegal -lambda_1 : \'%f\'. -lambda_1 cannot be less than zero."
                                                  ,(double)fVar13);
                                                  Color::print_error(&similar_str);
                                                  goto LAB_00140232;
                                                  }
                                                  hyper_param->lambda_1 = fVar13;
                                                  }
                                                }
                                                goto LAB_00140527;
                                              }
                                              hyper_param->quiet = true;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                  iVar9 = 1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_00140527;
              }
            }
          }
        }
      }
    }
LAB_0014051c:
    std::__cxx11::string::_M_assign(psVar12);
  }
LAB_00140527:
  uVar10 = uVar10 + iVar9;
  goto LAB_0013fe60;
}

Assistant:

bool Checker::check_train_options(HyperParam& hyper_param) {
  bool bo = true;
  /*********************************************************
   *  Check the file path of the training data             *
   *********************************************************/
  if (FileExist(args_[1].c_str())) {
    hyper_param.train_set_file = std::string(args_[1]);
  } else {
    Color::print_error(
      StringPrintf("Training data file: %s does not exist.", 
                    args_[1].c_str())
    );
    return false;
  }
  /*********************************************************
   *  Check each input argument                            *
   *********************************************************/
  StringList list(args_.begin()+2, args_.end());
  StrSimilar ss;
  for (int i = 0; i < list.size(); ) {
    if (list[i].compare("-s") == 0) {  // task type
      int value = atoi(list[i+1].c_str());
      if (value < 0 || value > 5) {
        Color::print_error(
            "-s can only be [0 - 5] : \n"
            "  for classification task: \n"
            "    0 -- linear model (GLM) \n"
            "    1 -- factorization machines (FM) \n"
            "    2 -- field-aware factorization machines (FFM) \n"
            "  for regression task: \n"
            "    3 -- linear model (GLM) \n"
            "    4 -- factorization machines (FM) \n"
            "    5 -- field-aware factorization machines (FFM)");
        bo = false;
      } else {
        switch (value) {
          case 0:
            hyper_param.loss_func = "cross-entropy";
            hyper_param.score_func = "linear";
            break;
          case 1:
            hyper_param.loss_func = "cross-entropy";
            hyper_param.score_func = "fm";
            break;
          case 2:
            hyper_param.loss_func = "cross-entropy";
            hyper_param.score_func = "ffm";
            break;
          case 3:
            hyper_param.loss_func = "squared";
            hyper_param.score_func = "linear";
            break;
          case 4:
            hyper_param.loss_func = "squared";
            hyper_param.score_func = "fm";
            break;
          case 5:
            hyper_param.loss_func = "squared";
            hyper_param.score_func = "ffm";
            break;
          default: break;
        }
      }
      i += 2;
    } else if (list[i].compare("-x") == 0) {  // metrics
      if (list[i+1].compare("acc") != 0 &&
          list[i+1].compare("prec") != 0 &&
          list[i+1].compare("recall") != 0 &&
          list[i+1].compare("f1") != 0 &&
          list[i+1].compare("auc") != 0 &&
          list[i+1].compare("mae") != 0 &&
          list[i+1].compare("mape") != 0 &&
          list[i+1].compare("rmsd") != 0 &&
          list[i+1].compare("rmse") != 0 &&
          list[i+1].compare("none") != 0) {
        Color::print_error(
          StringPrintf("Unknow metric: %s \n"
               " -x can only be: \n"
               "   acc \n"
               "   prec \n" 
               "   recall \n"
               "   f1 \n"
               "   auc\n"
               "   mae \n"
               "   mape \n"
               "   rmsd \n"
               "   rmse \n"
               "   none",
               list[i+1].c_str())
        );
        bo = false;
      } else {
        hyper_param.metric = list[i+1];
      }
      i += 2;
    } else if (list[i].compare("-p") == 0) {  // optimization method
      if (list[i+1].compare("adagrad") != 0 &&
          list[i+1].compare("ftrl") != 0 &&
          list[i+1].compare("sgd") != 0) {
        Color::print_error(
          StringPrintf("Unknow optimization method: %s \n"
               " -o can only be: adagrad and ftrl. \n",
               list[i+1].c_str())
        );
        bo = false;
      } else {
        hyper_param.opt_type = list[i+1];
      }
      i += 2;
    } else if (list[i].compare("-v") == 0) {  // validation file
      if (FileExist(list[i+1].c_str())) {
        hyper_param.validate_set_file = list[i+1];
      } else {
        Color::print_error(
          StringPrintf("Validation set file: %s dose not exists.",
                       list[i+1].c_str())
        );
        bo = false;
      }
      i += 2;
    } else if (list[i].compare("-m") == 0) {  // model file
      hyper_param.model_file = list[i+1];
      i += 2;
    } else if (list[i].compare("-t") == 0) { // txt model file
      hyper_param.txt_model_file = list[i+1];
      i += 2;
    } else if (list[i].compare("-l") == 0) {  // log file
      hyper_param.log_file = list[i+1];
      i += 2;
    } else if (list[i].compare("-k") == 0) {  // latent factor
      int value = atoi(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -k '%i'. -k must be geater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.num_K = value;
      }
      i += 2;
    } else if (list[i].compare("-r") == 0) {  // learning rate
      real_t value = atof(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -r : '%f'. -r must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.learning_rate = value;
      }
      i += 2;
    } else if (list[i].compare("-b") == 0) {  // regular lambda
      real_t value = atof(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -b : '%f' "
               "-b must be greater than or equal to zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.regu_lambda = value;
      }
      i += 2;
    } else if (list[i].compare("-u") == 0) {  // model scale
      real_t value = atof(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -u : '%f'. -u must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.model_scale = value;
      }
      i += 2;
    } else if (list[i].compare("-e") == 0) {  // number of epoch
      int value = atoi(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -e : '%i'. -e must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.num_epoch = value;
      }
      i += 2;
    } else if (list[i].compare("-f") == 0) {  // number of folds
      int value = atoi(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -f : '%i'. -f must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.num_folds = value;
      }
      i += 2;
    } else if (list[i].compare("-pre") == 0) {  // pre-trained model
      hyper_param.pre_model_file = list[i+1];
      i += 2;
    } else if (list[i].compare("-nthread") == 0) {  // number of thread
      int value = atoi(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -nthread : '%i'. -nthread must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.thread_number = value;
      }
      i += 2;
    } else if (list[i].compare("-block") == 0) {  // block size for on-disk training
      int value = atoi(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -block : '%i'. -block must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.block_size = value;
      }
      i += 2;
    } else if (list[i].compare("-sw") == 0) {  // window size for early stopping
      int value = atoi(list[i+1].c_str());
      if (value < 1) {
        Color::print_error(
          StringPrintf("Illegal -sw : '%i'. -sw must be greater than or equal to 1.",
               value)
        );
        bo = false;
      } else {
        hyper_param.stop_window = value;
      }
      i += 2;
    } else if (list[i].compare("-seed") == 0) {  // random seed
      int value = atoi(list[i+1].c_str());
      if (value < 1) {
        Color::print_error(
          StringPrintf("Illegal -seed : '%i'. -seed must be greater than or equal to 1.",
               value)
        );
        bo = false;
      } else {
        hyper_param.seed = value;
      }
      i += 2;
    } else if (list[i].compare("--disk") == 0) {  // on-disk training
      hyper_param.on_disk = true;
      i += 1;
    } else if (list[i].compare("--cv") == 0) {  // cross-validation
      hyper_param.cross_validation = true;
      i += 1;
    } else if (list[i].compare("--dis-lock-free") == 0) {  // lock-free training
      hyper_param.lock_free = false;
      i += 1;
    } else if (list[i].compare("--dis-es") == 0) {  // disable early-stop
      hyper_param.early_stop = false;
      i += 1;
    } else if (list[i].compare("--no-norm") == 0) {  // normalization
      hyper_param.norm = false;
      i += 1;
    } else if (list[i].compare("--no-bin") == 0) {  // do not generate bin file
      hyper_param.bin_out = false;
      i += 1;
    } else if (list[i].compare("--quiet") == 0) {  // quiet
      hyper_param.quiet = true;
      i += 1;
    } else if (list[i].compare("-alpha") == 0) {  // alpha
      real_t value = atof(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -alpha : '%f'. "
                       "-alpha must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.alpha = value;
      }
      i += 2;
    } else if (list[i].compare("-beta") == 0) {  // beta
      real_t value = atof(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -beta : '%f'. "
                       "-beta cannot be less than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.beta = value;
      }
      i += 2;
    } else if (list[i].compare("-lambda_1") == 0) {  // lambda_1
      real_t value = atof(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -lambda_1 : '%f'. "
                       "-lambda_1 cannot be less than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.lambda_1 = value;
      }
      i += 2;
    } else if (list[i].compare("-lambda_2") == 0) { // lambda_2
      real_t value = atof(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -lambda_2 : '%f'. "
                       "-lambda_2 cannot be less than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.lambda_2 = value;
      }
      i += 2;
    } else {  // no match
      std::string similar_str;
      ss.FindSimilar(list[i], menu_, similar_str);
      Color::print_error(
        StringPrintf("Unknow argument '%s'. Do you mean '%s' ?",
             list[i].c_str(),
             similar_str.c_str())
      );
      bo = false;
      break;
    }
  }
  if (!bo) { return false; }
  /*********************************************************
   *  Check warning and fix conflict                       *
   *********************************************************/
  check_conflict_train(hyper_param);
  /*********************************************************
   *  Set default value                                    *
   *********************************************************/
  if (hyper_param.model_file.empty() && !hyper_param.cross_validation) {
    hyper_param.model_file = hyper_param.train_set_file + ".model";
  }
  if (hyper_param.metric.compare("rmse") == 0) {
    hyper_param.metric = "rmsd";
  }

  return true;
}